

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiView.cpp
# Opt level: O0

string * Imf_3_3::removeViewName(string *channel,string *view)

{
  bool bVar1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  reference pvVar5;
  string *in_RSI;
  string *in_RDI;
  char unaff_retaddr;
  string *in_stack_00000008;
  size_t j;
  StringVector s;
  string *newName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff70;
  allocator<char> *in_stack_ffffffffffffff90;
  ulong uVar6;
  ulong __n;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  string local_50 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  string *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::string::string(local_50,in_RSI);
  anon_unknown_5::parseString(in_stack_00000008,unaff_retaddr);
  std::__cxx11::string::~string(local_50);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_30);
  if (sVar2 == 0) {
    in_stack_ffffffffffffff70 =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&stack0xffffffffffffffa3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,
               (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               in_stack_ffffffffffffff90);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa3);
  }
  else {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_30);
    if (sVar2 == 1) {
      std::__cxx11::string::string((string *)in_RDI,local_10);
    }
    else {
      std::__cxx11::string::string((string *)in_RDI);
      uVar6 = 0;
      while (__n = uVar6,
            sVar2 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(&local_30), uVar6 < sVar2) {
        pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(__n + 2);
        pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(&local_30);
        if (pbVar3 == pbVar4) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&local_30,__n);
          bVar1 = std::operator!=(pbVar3,in_stack_ffffffffffffff58);
          if (bVar1) goto LAB_00149d76;
        }
        else {
LAB_00149d76:
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&local_30,__n);
          std::__cxx11::string::operator+=((string *)in_RDI,(string *)pvVar5);
          in_stack_ffffffffffffff58 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(__n + 1);
          pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(&local_30);
          if (in_stack_ffffffffffffff58 != pbVar3) {
            std::__cxx11::string::operator+=((string *)in_RDI,".");
          }
        }
        uVar6 = __n + 1;
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_ffffffffffffff70);
  return in_RDI;
}

Assistant:

string
removeViewName (const string& channel, const string& view)
{
    StringVector s = parseString (channel, '.');

    if (s.size () == 0) return ""; // nothing in, nothing out

    if (s.size () == 1)
    {
        //
        // Channel in the default view, since no periods in its name.
        // No viewname to remove
        //

        return channel;
    }

    string newName;
    for (size_t j = 0; j < s.size (); ++j)
    {
        // only add the penultimate string part
        // if it doesn't match the view name
        if (j + 2 != s.size () || s[j] != view)
        {
            newName += s[j];
            if (j + 1 != s.size ()) { newName += "."; }
        }
    }

    return newName;
}